

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall aeron::ClientConductor::onClientTimeout(ClientConductor *this,int64_t clientId)

{
  bool bVar1;
  int64_t iVar2;
  string *file;
  long in_RSI;
  ClientTimeoutException *in_RDI;
  ClientTimeoutException exception;
  longlong now;
  allocator *paVar3;
  char *in_stack_fffffffffffffef8;
  string *function;
  string *what;
  allocator local_e1;
  string local_e0 [39];
  undefined1 local_b9 [56];
  allocator<char> local_81;
  string local_80 [8];
  longlong in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  exception local_60 [72];
  longlong local_18;
  long local_10;
  
  local_10 = in_RSI;
  iVar2 = DriverProxy::clientId
                    ((DriverProxy *)in_RDI[2].super_SourcedException.m_what._M_string_length);
  if (iVar2 == local_10) {
    bVar1 = isClosed((ClientConductor *)0x1ce0b8);
    if (!bVar1) {
      local_18 = std::function<long_long_()>::operator()
                           ((function<long_long_()> *)&in_RDI[6].super_SourcedException.m_what);
      closeAllResources((ClientConductor *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      what = (string *)&local_81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"client timeout from driver",(allocator *)what);
      function = (string *)local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_b9 + 1),
                 "void aeron::ClientConductor::onClientTimeout(std::int64_t)",(allocator *)function)
      ;
      file = (string *)util::past_prefix((char *)function,in_stack_fffffffffffffef8);
      paVar3 = &local_e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,(char *)file,paVar3);
      util::ClientTimeoutException::ClientTimeoutException
                (in_RDI,what,function,file,(int)((ulong)paVar3 >> 0x20));
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string((string *)(local_b9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_b9);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator(&local_81);
      std::function<void_(const_std::exception_&)>::operator()
                ((function<void_(const_std::exception_&)> *)
                 &in_RDI[5].super_SourcedException.m_where._M_string_length,local_60);
      util::ClientTimeoutException::~ClientTimeoutException((ClientTimeoutException *)0x1ce20f);
    }
  }
  return;
}

Assistant:

void ClientConductor::onClientTimeout(std::int64_t clientId)
{
    if (m_driverProxy.clientId() == clientId && !isClosed())
    {
        const long long now = m_epochClock();

        closeAllResources(now);

        ClientTimeoutException exception("client timeout from driver", SOURCEINFO);
        m_errorHandler(exception);
    }
}